

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

bool __thiscall CoreML::RangeValue::operator>(RangeValue *this,RangeValue *other)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  
  bVar2 = true;
  if (this->_isUnbound == false) {
    if (other->_isUnbound == false) {
      uVar1 = this->_val;
      sVar3 = value(other);
      return sVar3 < uVar1;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool RangeValue::operator> (const RangeValue& other) const {
    if (_isUnbound)
        return true;
    else if (other.isUnbound())
        return false;
    else
        return _val > other.value();
}